

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O3

int32_t __thiscall icu_63::UVector32::indexOf(UVector32 *this,int32_t key,int32_t startIndex)

{
  int32_t i;
  int *piVar1;
  
  if (startIndex < this->count) {
    piVar1 = this->elements + startIndex;
    do {
      if (*piVar1 == key) {
        return startIndex;
      }
      startIndex = startIndex + 1;
      piVar1 = piVar1 + 1;
    } while (this->count != startIndex);
  }
  return -1;
}

Assistant:

int32_t UVector32::indexOf(int32_t key, int32_t startIndex) const {
    int32_t i;
    for (i=startIndex; i<count; ++i) {
        if (key == elements[i]) {
            return i;
        }
    }
    return -1;
}